

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

int __thiscall Fossilize::ExternalReplayer::Impl::kill(Impl *this,__pid_t __pid,int __sig)

{
  FILE *__stream;
  int iVar1;
  ssize_t sVar2;
  uint *puVar3;
  undefined1 local_19;
  bool ret;
  Impl *pIStack_18;
  char dummy;
  Impl *this_local;
  
  if (this->pid < 0) {
    this_local._7_1_ = false;
  }
  else {
    pIStack_18 = this;
    if (-1 < this->kill_fd) {
      sVar2 = read(this->kill_fd,&local_19,1);
      if (sVar2 < 0) {
        close(this->kill_fd);
        this->kill_fd = -1;
        this_local._7_1_ = false;
        goto LAB_0021f92b;
      }
      close(this->kill_fd);
      this->kill_fd = -1;
    }
    iVar1 = killpg(this->pid,9);
    __stream = _stderr;
    this_local._7_1_ = iVar1 == 0;
    iVar1 = CONCAT31((int3)((uint)iVar1 >> 8),this_local._7_1_);
    if (!this_local._7_1_) {
      puVar3 = (uint *)__errno_location();
      iVar1 = fprintf(__stream,
                      "Fossilize INFO: ExternalReplayer::Impl::kill(): Failed to kill: errno %d.\n",
                      (ulong)*puVar3);
    }
    this = (Impl *)(ulong)CONCAT31((int3)((uint)iVar1 >> 8),this_local._7_1_);
  }
LAB_0021f92b:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool ExternalReplayer::Impl::kill()
{
	if (pid < 0)
		return false;

	if (kill_fd >= 0)
	{
		// Before we attempt to kill, we must make sure that the new process group has been created.
		// This read will block until we close the FD in the forked process, ensuring that we
		// can immediately call killpg() against it, since that close will only happen after setpgid().
		char dummy;
		if (::read(kill_fd, &dummy, sizeof(dummy)) < 0)
		{
			close(kill_fd);
			kill_fd = -1;
			return false;
		}
		close(kill_fd);
		kill_fd = -1;
	}

	bool ret = killpg(pid, SIGKILL) == 0;
	if (!ret)
		LOGI("ExternalReplayer::Impl::kill(): Failed to kill: errno %d.\n", errno);
	return ret;
}